

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Float_Test::iu_SyntaxTest_x_iutest_x_Float_Test
          (iu_SyntaxTest_x_iutest_x_Float_Test *this)

{
  iu_SyntaxTest_x_iutest_x_Float_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__iu_SyntaxTest_x_iutest_x_Float_Test_006274b0;
  return;
}

Assistant:

IUTEST(SyntaxTest, Float)
{
    if( float f = 1.0f )
        IUTEST_ASSERT_FLOAT_EQ(1.0f, f) << f;
    if( float f = 1.0f )
        IUTEST_EXPECT_FLOAT_EQ(1.0f, f) << f;
    if( float f = 1.0f )
        IUTEST_INFORM_FLOAT_EQ(1.0f, f) << f;
    if( float f = 1.0f )
        IUTEST_ASSUME_FLOAT_EQ(1.0f, f) << f;
}